

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::MultiNode<QByteArray,QByteArray>::insertMulti<QByteArray_const&>
          (MultiNode<QByteArray,_QByteArray> *this,QByteArray *args)

{
  long lVar1;
  QByteArray *this_00;
  MultiNodeChain<QByteArray> *pMVar2;
  long in_FS_OFFSET;
  Chain *e;
  QByteArray *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QByteArray *)operator_new(0x20);
  QByteArray::QByteArray(this_00,in_stack_ffffffffffffffc8);
  this_00[1].d.d = (Data *)0x0;
  pMVar2 = std::
           exchange<QHashPrivate::MultiNodeChain<QByteArray>*,QHashPrivate::MultiNodeChain<QByteArray>*&>
                     ((MultiNodeChain<QByteArray> **)this_00,
                      (MultiNodeChain<QByteArray> **)in_stack_ffffffffffffffc8);
  this_00[1].d.d = (Data *)pMVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void insertMulti(Args &&... args)
    {
        Chain *e = new Chain{ T(std::forward<Args>(args)...), nullptr };
        e->next = std::exchange(value, e);
    }